

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O3

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  uint *puVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  undefined1 auVar13 [32];
  uint *puVar14;
  uint uVar15;
  ulong *puVar16;
  int iVar17;
  long lVar18;
  float *pfVar19;
  ulong *puVar20;
  long lVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  iVar3 = bottom_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    iVar6 = bottom_blob->w;
    pvVar7 = top_blob->data;
    sVar8 = top_blob->cstep;
    sVar9 = top_blob->elemsize;
    pvVar10 = bottom_blob->data;
    sVar11 = bottom_blob->cstep;
    sVar12 = bottom_blob->elemsize;
    lVar21 = (long)((iVar6 - iVar4) * 2);
    lVar18 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar22 = 0.0;
      }
      else {
        fVar22 = *(float *)((long)&_bias->data + lVar18 * 4);
      }
      if (0 < iVar5) {
        pfVar19 = (float *)(sVar8 * sVar9 * lVar18 + (long)pvVar7);
        puVar20 = (ulong *)(sVar11 * sVar12 * lVar18 + (long)pvVar10);
        puVar16 = puVar20 + iVar6;
        puVar14 = (uint *)((long)puVar20 + (long)iVar6 * 4);
        iVar17 = 0;
        do {
          uVar15 = iVar4 + 1;
          if (0 < iVar4) {
            do {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *puVar20;
              auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)puVar20[1]),0x20);
              puVar20 = puVar20 + 1;
              auVar23 = vinsertps_avx(auVar23,ZEXT416(*puVar14),0x30);
              puVar1 = puVar14 + 1;
              puVar14 = puVar14 + 2;
              auVar26._16_8_ = *(undefined8 *)puVar1;
              auVar26._0_16_ = auVar23;
              auVar26._24_8_ = 0;
              auVar25._16_8_ = *puVar16;
              auVar25._0_16_ = auVar23;
              auVar25._24_8_ = 0;
              auVar25 = vshufpd_avx(auVar26,auVar25,2);
              pfVar2 = (float *)((long)&_kernel->data + lVar18 * 0x24);
              auVar24._0_4_ = auVar25._0_4_ * *pfVar2;
              auVar24._4_4_ = auVar25._4_4_ * pfVar2[1];
              auVar24._8_4_ = auVar25._8_4_ * pfVar2[2];
              auVar24._12_4_ = auVar25._12_4_ * pfVar2[3];
              auVar13._16_4_ = auVar25._16_4_ * pfVar2[4];
              auVar13._0_16_ = auVar24;
              auVar13._20_4_ = auVar25._20_4_ * pfVar2[5];
              auVar13._24_4_ = auVar25._24_4_ * pfVar2[6];
              auVar13._28_4_ = auVar25._28_4_;
              pfVar2 = (float *)(puVar16 + 1);
              puVar16 = puVar16 + 1;
              auVar23 = vhaddps_avx(auVar13._16_16_,auVar24);
              auVar23 = vhaddps_avx(auVar23,auVar23);
              auVar23 = vhaddps_avx(auVar23,auVar23);
              *pfVar19 = *(float *)((long)&_kernel->allocator + lVar18 * 0x24) * *pfVar2 + fVar22 +
                         auVar23._0_4_;
              pfVar19 = pfVar19 + 1;
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
          puVar20 = (ulong *)((long)puVar20 + lVar21 * 4);
          puVar14 = puVar14 + lVar21;
          puVar16 = (ulong *)((long)puVar16 + lVar21 * 4);
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar5);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}